

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_partitioned_aggregate.cpp
# Opt level: O0

void __thiscall
duckdb::PartitionedAggregateGlobalSinkState::PartitionedAggregateGlobalSinkState
          (PartitionedAggregateGlobalSinkState *this,PhysicalPartitionedAggregate *op,
          ClientContext *context)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  vector<duckdb::LogicalType,_true> *unaff_retaddr;
  Allocator *in_stack_00000008;
  ColumnDataCollection *in_stack_00000010;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff98;
  GlobalSinkState *in_stack_ffffffffffffffa0;
  ClientContext *context_00;
  
  GlobalSinkState::GlobalSinkState(in_stack_ffffffffffffffa0);
  *in_RDI = &PTR__PartitionedAggregateGlobalSinkState_03528fe8;
  ::std::mutex::mutex((mutex *)0x175257e);
  in_RDI[0x10] = in_RSI;
  context_00 = (ClientContext *)(in_RDI + 0x11);
  ::std::
  unordered_map<duckdb::Value,_duckdb::unique_ptr<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>,_true>,_duckdb::ValueHashFunction,_duckdb::ValueEquality,_std::allocator<std::pair<const_duckdb::Value,_duckdb::unique_ptr<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>,_true>_>_>_>
  ::unordered_map((unordered_map<duckdb::Value,_duckdb::unique_ptr<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>,_true>,_duckdb::ValueHashFunction,_duckdb::ValueEquality,_std::allocator<std::pair<const_duckdb::Value,_duckdb::unique_ptr<duckdb::GlobalUngroupedAggregateState,_std::default_delete<duckdb::GlobalUngroupedAggregateState>,_true>_>_>_>
                   *)0x17525a0);
  BufferAllocator::Get(context_00);
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)context_00,in_stack_ffffffffffffff98);
  ColumnDataCollection::ColumnDataCollection(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x17525f6);
  return;
}

Assistant:

PartitionedAggregateGlobalSinkState(const PhysicalPartitionedAggregate &op, ClientContext &context)
	    : op(op), aggregate_result(BufferAllocator::Get(context), op.types) {
	}